

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

void initDefaultMaterial(double ka,double kd,double ks,double kr,double kt,Color *color,Medium med,
                        int phong)

{
  defaultMaterial.ka = ka;
  defaultMaterial.kd = kd;
  defaultMaterial.ks = ks;
  defaultMaterial.kr = kr;
  defaultMaterial.kt = kt;
  defaultMaterial.color.x = color->x;
  defaultMaterial.color.y = color->y;
  defaultMaterial.color.z = color->z;
  defaultMaterial.med.ior = med.ior;
  defaultMaterial.med.beta = med.beta;
  defaultMaterial.p = phong;
  return;
}

Assistant:

void initDefaultMaterial(double ka, double kd, double ks, double kr, double kt, Color color, Grayzer::Medium med, int phong)
{
   defaultMaterial.ka     = ka;
   defaultMaterial.kd     = kd;
   defaultMaterial.ks     = ks;
   defaultMaterial.kr     = kr;
   defaultMaterial.kt     = kt;
   defaultMaterial.color  = color;
   defaultMaterial.med    = med;
   defaultMaterial.p      = phong;
}